

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t * Acb_NtkPlaces(char *pFileName,Vec_Ptr_t *vNames)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  char *__s2;
  char *__s1;
  size_t sVar5;
  int local_5c;
  int i;
  char *pName;
  char *pToken;
  char *pLimit;
  char *pBuffer;
  char *pTemp;
  int Pos;
  int First;
  Vec_Int_t *vPlaces;
  Vec_Ptr_t *vNames_local;
  char *pFileName_local;
  
  bVar1 = true;
  pTemp._0_4_ = -1;
  __s = Extra_FileReadContents(pFileName);
  sVar4 = strlen(__s);
  if (__s == (char *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    iVar2 = Vec_PtrSize(vNames);
    pFileName_local = (char *)Vec_IntAlloc(iVar2);
    for (pBuffer = __s; *pBuffer != '\0'; pBuffer = pBuffer + 1) {
      if (*pBuffer == '\n') {
        pTemp._0_4_ = ((int)pBuffer - (int)__s) + 1;
      }
      else if (*pBuffer == '(') {
        if (bVar1) {
          bVar1 = false;
        }
        else {
          __s2 = strtok(pBuffer + 1,"  \n\r\t");
          for (local_5c = 0; iVar2 = Vec_PtrSize(vNames), local_5c < iVar2; local_5c = local_5c + 1)
          {
            __s1 = (char *)Vec_PtrEntry(vNames,local_5c);
            iVar2 = strcmp(__s1,__s2);
            if (iVar2 == 0) {
              Vec_IntPushTwo((Vec_Int_t *)pFileName_local,(int)pTemp,local_5c);
            }
          }
          sVar5 = strlen(__s2);
          for (pBuffer = __s2 + sVar5; *pBuffer == '\0'; pBuffer = pBuffer + 1) {
          }
          if (__s + sVar4 <= pBuffer) {
            __assert_fail("pTemp < pLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                          ,0x2b9,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
          }
        }
      }
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)pFileName_local);
    iVar3 = Vec_PtrSize(vNames);
    if (iVar2 != iVar3 * 2) {
      __assert_fail("Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x2bd,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
  }
  return (Vec_Int_t *)pFileName_local;
}

Assistant:

Vec_Int_t * Acb_NtkPlaces( char * pFileName, Vec_Ptr_t * vNames )
{
    Vec_Int_t * vPlaces; int First = 1, Pos = -1;
    char * pTemp, * pBuffer = Extra_FileReadContents( pFileName );
    char * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    vPlaces = Vec_IntAlloc( Vec_PtrSize(vNames) );
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == '\n' )
            Pos = pTemp - pBuffer + 1;
        else if ( *pTemp == '(' )
        {
            if ( First )
                First = 0;
            else
            {
                char * pToken = strtok( pTemp+1, "  \n\r\t" );
                char * pName; int i;
                Vec_PtrForEachEntry( char *, vNames, pName, i )
                    if ( !strcmp(pName, pToken) )
                        Vec_IntPushTwo( vPlaces, Pos, i );
                pTemp = pToken + strlen(pToken);
                while ( *pTemp == 0 )
                    pTemp++;
                assert( pTemp < pLimit );
            }
        }
    }
    assert( Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames) );
    ABC_FREE( pBuffer );
    return vPlaces;
}